

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void writeAltFmtO(FILE *outf,int showBegin,int showEnd,char *groupname,dotNode *(*results) [7],
                 int spike)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined *puVar4;
  byte bVar5;
  char *pcVar6;
  long lVar7;
  undefined8 uVar8;
  dotNode *pdVar9;
  bool bVar10;
  char *pcVar11;
  long lVar12;
  
  lVar12 = 0;
  do {
    fprintf((FILE *)outf,"begin_object %s%d\n",(&PTR_anon_var_dwarf_11b28_0014bd50)[lVar12],
            (ulong)((showEnd != 0 && showBegin == 0) + 1));
    fwrite("mode solid\n",0xb,1,(FILE *)outf);
    lVar7 = 0;
    do {
      pdVar9 = results[lVar7][lVar12];
      if (pdVar9 != (dotNode *)0x0) {
        pcVar6 = getColor((int)lVar7);
        pcVar11 = "--none--";
        do {
          if ((ColorGap == '\0') && (pcVar6 = "124", pdVar9->t != (atom *)0x0)) {
            pcVar6 = assignGapColorForO(pdVar9->gap,(int)lVar12);
          }
          if (pcVar6 != pcVar11) {
            fprintf((FILE *)outf,"colour %s\n",pcVar6);
            pcVar11 = pcVar6;
          }
          dVar1 = (pdVar9->loc).x;
          dVar2 = (pdVar9->loc).y;
          dVar3 = (pdVar9->loc).z;
          if ((int)lVar12 - 3U < 3 && spike != 0) {
            fprintf((FILE *)outf,"move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",dVar1,dVar2,dVar3,
                    (pdVar9->spike).x,(pdVar9->spike).y,(pdVar9->spike).z);
          }
          else {
            fprintf((FILE *)outf,"sphere_xyz %.3f %.3f %.3f 0.03\n",dVar1,dVar2,dVar3);
          }
          pdVar9 = pdVar9->next;
        } while (pdVar9 != (dotNode_t *)0x0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x72);
    fwrite("end_object\n",0xb,1,(FILE *)outf);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 7);
  if (showEnd != 0) {
    if (showBegin == 0) {
      fwrite("begin_object contsurf\n",0x16,1,(FILE *)outf);
    }
    else {
      fprintf((FILE *)outf,"begin_object %s\n",groupname);
    }
    lVar12 = 0;
    do {
      puVar4 = (&PTR_anon_var_dwarf_11b28_0014bd50)[lVar12];
      uVar8 = 1;
      bVar5 = 0;
      do {
        bVar10 = (bool)(bVar5 | (showBegin != 0 && showEnd != 0));
        fprintf((FILE *)outf,"instance %s%d\n",puVar4,uVar8);
        uVar8 = 2;
        bVar5 = 1;
      } while (!bVar10);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 7);
    fwrite("end_object\n",0xb,1,(FILE *)outf);
    return;
  }
  return;
}

Assistant:

void writeAltFmtO(FILE *outf, int showBegin, int showEnd,
      char* groupname, dotNode *results[][NODEWIDTH], int spike)
{
   int i, j, numGroups, gn;
   dotNode *node;
   char *color = "", *prevColor = "";
   //Old: char *mast[NODEWIDTH] = {"WC", "CC", "SO", "BO", "HB"};
   char *mast[NODEWIDTH] = {"WC", "CC", "WH", "SO", "BO", "WO", "HB"}; /* 04/15/2015 SJ changed to match new NODEWIDTH, see probe.h*/
    
   numGroups = (showBegin && showEnd) ? 1 : 2;
   gn = (!showBegin && showEnd) ? 2 : 1;

   for (j = 0; j < NODEWIDTH; j++) {
      fprintf(outf, "begin_object %s%d\n", mast[j], gn);
      fprintf(outf, "mode solid\n");

      for (i = 0; i < NUMATOMTYPES; i++) {
	 prevColor = "--none--";
	 node = results[i][j];
	 if (node) {
	    color = convertKinColorToXV(getColor(i));
	 }
	 while(node) {
	    if (ColorGap) {
	       if (node->t) {
		  color = assignGapColorForO(node->gap, j);
	       }
	       else { color = "124";}
	    }
	    if (color != prevColor) {
	       fprintf(outf, "colour %s\n", color);
	       prevColor = color;
	    }
	    if ((j == 3 || j == 4 || j ==5) && spike) {/* bump */ /* 04/15/2015 SJ changed j numbers to match new ones for so, bo, and wo*/
	       fprintf(outf,
		  "move %.3f %.3f %.3f\nline %.3f %.3f %.3f\n",
		  node->loc.x, node->loc.y, node->loc.z,
		  node->spike.x, node->spike.y, node->spike.z);
	    }
	    else {/* contact or H-bond */
	       fprintf(outf, "sphere_xyz %.3f %.3f %.3f 0.03\n",
		  node->loc.x, node->loc.y, node->loc.z);
	    }
	    node = node->next;
	 }
      }
      fprintf(outf, "end_object\n");
   }

   if (showEnd) {
      if (showBegin) { fprintf(outf, "begin_object %s\n", groupname); }
      else           { fprintf(outf, "begin_object contsurf\n"); }
      for (j = 0; j < NODEWIDTH; j++) {
	 for (i = 0; i < numGroups; i++) {
	    fprintf(outf, "instance %s%d\n", mast[j], i+1);
	 }
      }
      fprintf(outf, "end_object\n");
   }
}